

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

void __thiscall BaseIndex::SetBestBlockIndex(BaseIndex *this,CBlockIndex *block)

{
  int iVar1;
  long in_FS_OFFSET;
  PruneLockInfo local_34;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_chainstate->m_blockman->m_prune_mode == true) {
    iVar1 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[10])(this);
    if ((char)iVar1 == '\0') {
      __assert_fail("!m_chainstate->m_blockman.IsPruneMode() || AllowPrune()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp"
                    ,0x1b5,"void BaseIndex::SetBestBlockIndex(const CBlockIndex *)");
    }
  }
  iVar1 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[10])(this);
  if ((block != (CBlockIndex *)0x0) && ((char)iVar1 != '\0')) {
    local_34.height_first = block->nHeight;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_30,&cs_main,"::cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp"
               ,0x1ba,false);
    ::node::BlockManager::UpdatePruneLock(this->m_chainstate->m_blockman,&this->m_name,&local_34);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  }
  LOCK();
  (this->m_best_block_index)._M_b._M_p = block;
  UNLOCK();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BaseIndex::SetBestBlockIndex(const CBlockIndex* block)
{
    assert(!m_chainstate->m_blockman.IsPruneMode() || AllowPrune());

    if (AllowPrune() && block) {
        node::PruneLockInfo prune_lock;
        prune_lock.height_first = block->nHeight;
        WITH_LOCK(::cs_main, m_chainstate->m_blockman.UpdatePruneLock(GetName(), prune_lock));
    }

    // Intentionally set m_best_block_index as the last step in this function,
    // after updating prune locks above, and after making any other references
    // to *this, so the BlockUntilSyncedToCurrentChain function (which checks
    // m_best_block_index as an optimization) can be used to wait for the last
    // BlockConnected notification and safely assume that prune locks are
    // updated and that the index object is safe to delete.
    m_best_block_index = block;
}